

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

void __thiscall
pstd::
vector<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_pstd::pmr::polymorphic_allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
::vector(vector<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_pstd::pmr::polymorphic_allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
         *this,size_t count,
        basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **value,
        polymorphic_allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
        *alloc)

{
  undefined8 *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **in_RDX;
  vector<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_pstd::pmr::polymorphic_allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  *in_RSI;
  polymorphic_allocator<std::__cxx11::string_const*> *in_RDI;
  size_t i;
  vector<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_pstd::pmr::polymorphic_allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  *local_28;
  
  *(undefined8 *)in_RDI = *in_RCX;
  *(undefined8 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  *(undefined8 *)(in_RDI + 0x18) = 0;
  reserve(in_RSI,(size_t)in_RDX);
  for (local_28 = (vector<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_pstd::pmr::polymorphic_allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                   *)0x0; local_28 < in_RSI;
      local_28 = (vector<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_pstd::pmr::polymorphic_allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                  *)((long)&(local_28->alloc).memoryResource + 1)) {
    pmr::polymorphic_allocator<std::__cxx11::string_const*>::
    construct<std::__cxx11::string_const*,std::__cxx11::string_const*const&>
              (in_RDI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      (*(long *)(in_RDI + 8) + (long)local_28 * 8),in_RDX);
  }
  *(vector<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_pstd::pmr::polymorphic_allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
    **)(in_RDI + 0x18) = in_RSI;
  return;
}

Assistant:

vector(size_t count, const T &value, const Allocator &alloc = {}) : alloc(alloc) {
        reserve(count);
        for (size_t i = 0; i < count; ++i)
            this->alloc.template construct<T>(ptr + i, value);
        nStored = count;
    }